

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

PipelineClassifier *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::PipelineClassifier>
          (Arena *arena)

{
  PipelineClassifier *pPVar1;
  
  if (arena != (Arena *)0x0) {
    pPVar1 = DoCreateMessage<CoreML::Specification::PipelineClassifier>(arena);
    return pPVar1;
  }
  pPVar1 = (PipelineClassifier *)operator_new(0x20);
  CoreML::Specification::PipelineClassifier::PipelineClassifier(pPVar1,(Arena *)0x0,false);
  return pPVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }